

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O2

double ising::square::transfer_matrix::free_energy
                 (double beta,int Lx,int Ly,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  pointer pdVar1;
  byte bVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int y;
  ulong uVar8;
  size_type __n;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_type __n_00;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db_00;
  exp_double weight;
  double local_f0;
  int local_e8;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> field_x;
  exp_double sum;
  vector<double,_std::allocator<double>_> inter_y;
  vector<double,_std::allocator<double>_> inter_x;
  
  __n_00 = (size_type)Lx;
  std::vector<double,_std::allocator<double>_>::vector(&inter_x,__n_00,(allocator_type *)&inter_y);
  std::vector<double,_std::allocator<double>_>::vector(&inter_y,__n_00,(allocator_type *)&field_x);
  __n = 0;
  if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    __n = __n_00;
  }
  std::vector<double,_std::allocator<double>_>::vector(&field_x,__n,(allocator_type *)&v);
  bVar2 = (byte)Lx & 0x1f;
  uVar7 = 1 << bVar2;
  std::vector<double,_std::allocator<double>_>::vector(&v,(long)(int)uVar7,(allocator_type *)&sum);
  sum.sign_ = 0;
  sum.log_ = 0.0;
  uVar8 = 0;
  uVar10 = (ulong)(uint)Lx;
  if (Lx < 1) {
    uVar10 = uVar8;
  }
  uVar11 = (ulong)(uint)Ly;
  if (Ly < 1) {
    uVar11 = uVar8;
  }
  uVar4 = 0;
  if (0 < 1 << bVar2) {
    uVar4 = (ulong)uVar7;
  }
  uVar14 = extraout_XMM0_Da;
  uVar15 = extraout_XMM0_Db;
  for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    weight.sign_ = 1;
    weight.log_ = 0.0;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = 0.0;
    }
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = 1.0;
    lVar12 = 0;
    lVar13 = 8;
    for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
      pdVar1 = (inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar9 = 0; uVar10 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
        *(undefined8 *)
         ((long)inter_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9) =
             *(undefined8 *)((long)pdVar1 + lVar9 * 2 + lVar13 + -8);
        *(undefined8 *)
         ((long)inter_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9) =
             *(undefined8 *)((long)pdVar1 + lVar9 * 2 + lVar13);
      }
      if (field_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          field_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pdVar1 = (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
          field_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = *(double *)((long)pdVar1 + uVar6 * 8 + lVar12);
        }
      }
      product_D<std::vector<double,std::allocator<double>>>
                ((transfer_matrix *)&local_f0,beta,&inter_x,&field_x,&v);
      weight.log_ = weight.log_ + local_f0;
      weight.sign_ = weight.sign_ * local_e8;
      if (ABS(weight.log_ / local_f0) < 1e-10) {
        weight.log_ = 0.0;
      }
      product_U<std::vector<double,std::allocator<double>>>
                ((transfer_matrix *)&local_f0,beta,&inter_y,&v);
      weight.log_ = weight.log_ + local_f0;
      weight.sign_ = weight.sign_ * local_e8;
      if (ABS(weight.log_ / local_f0) < 1e-10) {
        weight.log_ = 0.0;
      }
      lVar13 = lVar13 + __n_00 * 0x10;
      lVar12 = lVar12 + __n_00 * 8;
    }
    standards::exp_number<double>::operator*=
              (&weight,v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8]);
    standards::exp_number<double>::operator+=(&sum,&weight);
    uVar14 = extraout_XMM0_Da_00;
    uVar15 = extraout_XMM0_Db_00;
  }
  dVar3 = standards::exp_number<double>::log(&sum,(double)CONCAT44(uVar15,uVar14));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&field_x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inter_y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inter_x.super__Vector_base<double,_std::allocator<double>_>);
  return -dVar3 / beta;
}

Assistant:

static double free_energy(double beta, int Lx, int Ly,
                            std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    std::vector<double> inter_x(Lx), inter_y(Lx), field_x(field.size() > 0 ? Lx : 0);
    int dim = 1 << Lx;
    std::vector<double> v(dim);
    exp_double sum = 0;
    for (int i = 0; i < dim; ++i) {
      exp_double weight = 1;
      for (int j = 0; j < dim; ++j) v[j] = 0;
      v[i] = 1;
      for (int y = 0; y < Ly; ++y) {
        for (int x = 0; x < Lx; ++x) {
          inter_x[x] = inter[2 * (Lx * y + x)];
          inter_y[x] = inter[2 * (Lx * y + x) + 1];
        }
        if (field_x.size()) {
          for (int x = 0; x < Lx; ++x) {
            field_x[x] = field[Lx * y + x];
          }
        }
        weight *= ising::square::transfer_matrix::product_D(beta, inter_x, field_x, v);
        weight *= ising::square::transfer_matrix::product_U(beta, inter_y, v);
      }
      weight *= v[i];
      sum += weight;
    }
    return -log(sum) / beta;
  }